

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::ImageFeatureType_ImageSizeRange::MergePartialFromCodedStream
          (ImageFeatureType_ImageSizeRange *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  int iVar6;
  SizeRange *pSVar7;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong uVar8;
  int local_38;
  int local_34;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001d44d6;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001d44d6:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar8 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar4 | uVar8;
    }
    uVar4 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) == 0) {
LAB_001d4563:
      iVar6 = 7;
      if ((uVar4 & 7) != 4 && uVar4 != 0) {
        bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
        if (bVar3) goto LAB_001d4588;
        iVar6 = 6;
      }
    }
    else {
      uVar5 = (uint)(uVar8 >> 3) & 0x1fffffff;
      if (uVar5 == 2) {
        if ((char)uVar8 != '\x12') goto LAB_001d4563;
        if (this->heightrange_ == (SizeRange *)0x0) {
          pSVar7 = (SizeRange *)operator_new(0x28);
          SizeRange::SizeRange(pSVar7);
          this->heightrange_ = pSVar7;
        }
        MergePartialFromCodedStream();
        iVar6 = local_38;
        if ((extraout_RAX_00 & 1) == 0) goto LAB_001d4588;
      }
      else {
        if ((uVar5 != 1) || ((char)uVar8 != '\n')) goto LAB_001d4563;
        if (this->widthrange_ == (SizeRange *)0x0) {
          pSVar7 = (SizeRange *)operator_new(0x28);
          SizeRange::SizeRange(pSVar7);
          this->widthrange_ = pSVar7;
        }
        MergePartialFromCodedStream();
        iVar6 = local_34;
        if ((extraout_RAX & 1) != 0) goto LAB_001d458a;
LAB_001d4588:
        iVar6 = 0;
      }
    }
LAB_001d458a:
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool ImageFeatureType_ImageSizeRange::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ImageFeatureType.ImageSizeRange)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.SizeRange widthRange = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_widthrange()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SizeRange heightRange = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_heightrange()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ImageFeatureType.ImageSizeRange)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ImageFeatureType.ImageSizeRange)
  return false;
#undef DO_
}